

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::String::ShowWideCString(String *this,wchar_t *wide_c_str)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  String SVar2;
  String local_20;
  
  if (wide_c_str == (wchar_t *)0x0) {
    String(this,"(null)");
    sVar1 = extraout_RDX_00;
  }
  else {
    WideStringToUtf8((internal *)&local_20,wide_c_str,-1);
    String(this,local_20.c_str_);
    ~String(&local_20);
    sVar1 = extraout_RDX;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String String::ShowWideCString(const wchar_t * wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String(internal::WideStringToUtf8(wide_c_str, -1).c_str());
}